

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3DoOptimize(Fts3Table *p,int bReturnDone)

{
  byte bVar1;
  sqlite3_stmt *pStmt;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Mem *pMem;
  i64 iVar5;
  uint uVar6;
  long in_FS_OFFSET;
  sqlite3_stmt *pAllLangid;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (sqlite3_stmt *)0x0;
  uVar2 = sqlite3Fts3PendingTermsFlush(p);
  if (uVar2 == 0) {
    uVar2 = fts3SqlStmt(p,0x1b,&local_40,(sqlite3_value **)0x0);
  }
  pStmt = local_40;
  uVar4 = 0;
  uVar6 = uVar4;
  if (uVar2 == 0) {
    sqlite3_bind_int64(local_40,1,(long)p->iPrevLangid);
    sqlite3_bind_int64(pStmt,2,(long)p->nIndex);
    iVar3 = sqlite3_step(pStmt);
    uVar6 = 0;
    if (iVar3 == 100) {
      bVar1 = 0;
      uVar4 = 0;
      do {
        pMem = columnMem(pStmt,0);
        iVar5 = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        if ((uVar4 == 0) && (0 < p->nIndex)) {
          iVar3 = 0;
          do {
            uVar4 = fts3SegmentMerge(p,(int)iVar5,iVar3,-2);
            if (uVar4 == 0x65) {
              uVar4 = 0;
              bVar1 = 1;
            }
          } while ((uVar4 == 0) && (iVar3 = iVar3 + 1, iVar3 < p->nIndex));
        }
        iVar3 = sqlite3_step(pStmt);
      } while (iVar3 == 100);
      uVar6 = (uint)bVar1;
    }
    uVar2 = sqlite3_reset(pStmt);
    if (uVar4 != 0) {
      uVar2 = uVar4;
    }
  }
  sqlite3_blob_close(p->pSegments);
  uVar4 = 0x65;
  if (uVar6 == 0) {
    uVar4 = uVar2;
  }
  if (uVar2 != 0) {
    uVar4 = uVar2;
  }
  if (bReturnDone == 0) {
    uVar4 = uVar2;
  }
  p->pSegments = (sqlite3_blob *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3DoOptimize(Fts3Table *p, int bReturnDone){
  int bSeenDone = 0;
  int rc;
  sqlite3_stmt *pAllLangid = 0;

  rc = sqlite3Fts3PendingTermsFlush(p);
  if( rc==SQLITE_OK ){
    rc = fts3SqlStmt(p, SQL_SELECT_ALL_LANGID, &pAllLangid, 0);
  }
  if( rc==SQLITE_OK ){
    int rc2;
    sqlite3_bind_int(pAllLangid, 1, p->iPrevLangid);
    sqlite3_bind_int(pAllLangid, 2, p->nIndex);
    while( sqlite3_step(pAllLangid)==SQLITE_ROW ){
      int i;
      int iLangid = sqlite3_column_int(pAllLangid, 0);
      for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
        rc = fts3SegmentMerge(p, iLangid, i, FTS3_SEGCURSOR_ALL);
        if( rc==SQLITE_DONE ){
          bSeenDone = 1;
          rc = SQLITE_OK;
        }
      }
    }
    rc2 = sqlite3_reset(pAllLangid);
    if( rc==SQLITE_OK ) rc = rc2;
  }

  sqlite3Fts3SegmentsClose(p);

  return (rc==SQLITE_OK && bReturnDone && bSeenDone) ? SQLITE_DONE : rc;
}